

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.cpp
# Opt level: O2

void __thiscall Js::StreamWriter::Write(StreamWriter *this,void *pv,size_t cb)

{
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  uint lhs;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  void *__frameAddr;
  byte *pbVar7;
  undefined1 local_70 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  
  scriptContext = (this->super_ScriptContextHolder).m_scriptContext;
  uVar4 = UInt32Math::Add((uint32)this->m_current,(uint32)cb);
  if (this->m_capacity <= (ulong)uVar4) {
    iVar5 = (int)this->m_capacity;
    if (iVar5 < 0) {
      ::Math::DefaultOverflowPolicy();
    }
    __leaveScriptObject._32_8_ = &this->m_capacity;
    lhs = iVar5 * 2;
    if (lhs < uVar4) {
      lhs = uVar4;
    }
    uVar4 = UInt32Math::Add(lhs,100);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    iVar5 = (**this->m_stream->_vptr_HostStream)
                      (this->m_stream,this->m_buffer,(ulong)uVar4,__leaveScriptObject._32_8_);
    this->m_buffer = (byte *)CONCAT44(extraout_var,iVar5);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_70);
  }
  pbVar7 = this->m_buffer;
  if (pbVar7 == (byte *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/StreamWriter.cpp"
                                ,0x18,"(m_buffer != nullptr)","m_buffer != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    pbVar7 = this->m_buffer;
  }
  js_memcpy_s(pbVar7 + this->m_current,cb,pv,cb);
  this->m_current = this->m_current + cb;
  return;
}

Assistant:

void StreamWriter::Write(const void* pv, size_t cb)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 newSize = UInt32Math::Add((uint32)m_current, (uint32)cb);
        if (newSize >= m_capacity)
        {
            size_t newCapacity = UInt32Math::Add(max(newSize, UInt32Math::Mul((uint32)m_capacity, 2)), 100);
            BEGIN_LEAVE_SCRIPT(scriptContext)
            {
                m_buffer = m_stream->ExtendBuffer(m_buffer, newCapacity, &m_capacity);
            }
            END_LEAVE_SCRIPT(scriptContext);
        }

        Assert(m_buffer != nullptr);
        js_memcpy_s(m_buffer + m_current, cb, pv, cb);
        m_current += cb;
    }